

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::Set(CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2d7,"(level == 0)","level == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  CharBitvec::SetRange(&this->vec,l & 0xff,h & 0xff);
  bVar2 = CharBitvec::IsFull(&this->vec);
  if (bVar2) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharSetLeaf>
              (allocator,this);
    this = (CharSetLeaf *)&CharSetFull::Instance;
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        vec.SetRange(leafIdx(l), leafIdx(h));
        if (vec.IsFull())
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }